

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::e_formatter<spdlog::details::scoped_padder>::format
          (e_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  memory_buf_t *in_RDI;
  scoped_padder p;
  size_t field_size;
  duration<long,_std::ratio<1L,_1000L>_> millis;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  memory_buf_t *in_stack_ffffffffffffff98;
  padding_info *in_stack_ffffffffffffffa0;
  time_point in_stack_ffffffffffffffa8;
  scoped_padder *in_stack_ffffffffffffffb0;
  duration<long,_std::ratio<1L,_1000L>_> local_28 [5];
  
  local_28[0] = fmt_helper::time_fraction<std::chrono::duration<long,std::ratio<1l,1000l>>>
                          (in_stack_ffffffffffffffa8);
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8.__d.__r,
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(local_28);
  fmt_helper::pad3<unsigned_int>(in_stack_ffffffffffffff94,in_RDI);
  scoped_padder::~scoped_padder
            ((scoped_padder *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        auto millis = fmt_helper::time_fraction<std::chrono::milliseconds>(msg.time);
        const size_t field_size = 3;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
    }